

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryStats.cpp
# Opt level: O3

void __thiscall DictionaryStats::DictionaryStats(DictionaryStats *this,char *name,uint bucketCount)

{
  char cVar1;
  int iVar2;
  DictionaryType *__s;
  long lVar3;
  
  this->pNext = (DictionaryStats *)0x0;
  this->initialSize = bucketCount;
  this->finalSize = bucketCount;
  this->countOfEmptyBuckets = bucketCount;
  this->countOfResize = 0;
  this->itemCount = 0;
  this->maxDepth = 0;
  this->lookupCount = 0;
  this->collisionCount = 0;
  this->lookupDepthTotal = 0;
  *(undefined8 *)&this->maxLookupDepth = 0;
  *(undefined4 *)((long)&this->pName + 4) = 0;
  CCLock::Enter(&dictionaryTypesCriticalSection.super_CCLock);
  for (__s = dictionaryTypes; __s != (DictionaryType *)0x0; __s = __s->pNext) {
    iVar2 = strncmp(name,__s->name,0xff);
    if (iVar2 == 0) goto LAB_0068f7ef;
  }
  __s = (DictionaryType *)
        Memory::NoCheckHeapAllocator::Alloc
                  ((NoCheckHeapAllocator *)&Memory::NoCheckHeapAllocator::Instance,0x118);
  memset(__s,0,0x118);
  __s->pNext = dictionaryTypes;
  dictionaryTypes = __s;
  if (name == (char *)0x0) {
    memset(__s->name + 1,0xfd,0xff);
    RaiseException(0xc000000d,0,0,(ULONG_PTR *)0x0);
  }
  else {
    lVar3 = -0x100;
    do {
      cVar1 = name[lVar3 + 0x100];
      *(char *)((long)&__s->instances + lVar3) = cVar1;
      if (cVar1 == '\0') {
        lVar3 = -lVar3;
        goto LAB_0068f7c7;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != -1);
    __s->name[0xff] = '\0';
    lVar3 = 1;
LAB_0068f7c7:
    if (-lVar3 + 0x101U < 0x100) {
      memset((void *)((long)__s + -lVar3 + 0x111),0xfd,lVar3 - 1);
    }
  }
  __s->name[0xff] = '\0';
LAB_0068f7ef:
  CCLock::Leave(&dictionaryTypesCriticalSection.super_CCLock);
  this->pName = __s->name;
  this->pNext = __s->instances;
  __s->instances = this;
  __s->instancesCount = __s->instancesCount + 1;
  return;
}

Assistant:

DictionaryStats::DictionaryStats(const char* name, uint bucketCount)
    :
    initialSize(bucketCount),
    finalSize(bucketCount),
    countOfEmptyBuckets(bucketCount),
    countOfResize(0),
    itemCount(0),
    maxDepth(0),
    lookupCount(0),
    collisionCount(0),
    lookupDepthTotal(0),
    maxLookupDepth(0),
    pNext(NULL),
    pName(NULL)
{
    DictionaryStats::dictionaryTypesCriticalSection.Enter();
    DictionaryType* type = NULL;
    // See if we already created instance(s) of this type
    DictionaryType* current = dictionaryTypes;
    while(current)
    {
        if (strncmp(name, current->name, _countof(current->name)-1) == 0)
        {
            type = current;
            break;
        }
        current = current->pNext;
    }

    if (!type)
    {
        // We haven't seen this type before so add a new entry for it
        type = NoCheckHeapNew(DictionaryType);
        type->pNext = dictionaryTypes;
        dictionaryTypes = type;
        type->instancesCount = 0;
        strncpy_s(type->name, name, _countof(type->name)-1);
        type->name[sizeof(type->name)-1]='\0';
    }
    dictionaryTypesCriticalSection.Leave();
    // keep a pointer to the name in case we are asked to clone ourselves
    pName = type->name;

    // Add ourself in the list
    pNext = type->instances;
    type->instances = this;
    ++(type->instancesCount);
}